

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::CopyImage::FunctionalTest::iterate(FunctionalTest *this)

{
  targetDesc *desc_00;
  GLuint *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  deUint32 err;
  GLuint GVar7;
  IterateResult IVar8;
  undefined4 extraout_var;
  GLenum extraout_EDX;
  uint uVar10;
  FunctionalTest *this_01;
  testCase *test_case;
  GLubyte *src_pixels [3];
  GLubyte *dst_pixels [3];
  targetDesc desc;
  long lVar9;
  
  dst_pixels[2] = (GLubyte *)0x0;
  dst_pixels[0] = (GLubyte *)0x0;
  dst_pixels[1] = (GLubyte *)0x0;
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar6);
  src_pixels[0] = (GLubyte *)0x0;
  src_pixels[1] = (GLubyte *)0x0;
  src_pixels[2] = (GLubyte *)0x0;
  test_case = (this->m_test_cases).
              super__Vector_base<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_test_case_index;
  (**(code **)(lVar9 + 0xff0))(0xd05,1);
  (**(code **)(lVar9 + 0xff0))(0xcf5,1);
  err = (**(code **)(lVar9 + 0x800))();
  glu::checkError(err,"PixelStorei",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                  ,0xaa8);
  prepareDstPxls(this,&test_case->m_dst,dst_pixels);
  desc_00 = &test_case->m_src;
  prepareSrcPxls(this,desc_00,extraout_EDX,src_pixels);
  GVar7 = prepareTexture(this,&test_case->m_dst,dst_pixels,&this->m_dst_buf_name);
  this->m_dst_tex_name = GVar7;
  if (desc_00->m_target == 0x8d41) {
    uVar1 = desc_00->m_width;
    uVar2 = (test_case->m_src).m_height;
    uVar3 = (test_case->m_src).m_level;
    uVar4 = (test_case->m_src).m_internal_format;
    desc.m_format = (test_case->m_src).m_format;
    desc.m_type = (test_case->m_src).m_type;
    desc.m_width = uVar1;
    desc.m_target = 0xde1;
    desc.m_height = uVar2;
    desc.m_level = uVar3;
    desc.m_internal_format = uVar4;
    GVar7 = prepareTexture(this,desc_00,src_pixels,&this->m_src_buf_name);
    this->m_rb_name = GVar7;
    GVar7 = prepareTexture(this,&desc,src_pixels,&this->m_src_buf_name);
  }
  else {
    GVar7 = prepareTexture(this,desc_00,src_pixels,&this->m_src_buf_name);
  }
  this->m_src_tex_name = GVar7;
  bVar5 = copyAndVerify(this,test_case,dst_pixels,src_pixels);
  this_01 = this;
  clean(this);
  cleanPixels(this_01,dst_pixels);
  cleanPixels(this_01,src_pixels);
  if (bVar5) {
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    uVar10 = this->m_test_case_index + 1;
    this->m_test_case_index = uVar10;
    IVar8 = (IterateResult)
            ((ulong)uVar10 <
            (ulong)(((long)(this->m_test_cases).
                           super__Vector_base<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_test_cases).
                          super__Vector_base<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x50));
  }
  else {
    desc._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = &desc.m_height;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"Failure. ");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&desc,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
    IVar8 = STOP;
  }
  return IVar8;
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest::iterate()
{
	GLubyte*					 dst_pixels[FUNCTIONAL_TEST_N_LEVELS] = { 0 };
	const Functions&			 gl									  = m_context.getRenderContext().getFunctions();
	tcu::TestNode::IterateResult it_result							  = tcu::TestNode::STOP;
	bool						 result								  = false;
	GLubyte*					 src_pixels[FUNCTIONAL_TEST_N_LEVELS] = { 0 };
	const testCase&				 test_case							  = m_test_cases[m_test_case_index];

	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "PixelStorei");

	try
	{
		/* Prepare pixels */
		prepareDstPxls(test_case.m_dst, dst_pixels);
		prepareSrcPxls(test_case.m_src, test_case.m_dst.m_internal_format, src_pixels);

		/* Prepare textures */
		m_dst_tex_name = prepareTexture(test_case.m_dst, (const GLubyte**)dst_pixels, m_dst_buf_name);

		if (GL_RENDERBUFFER == test_case.m_src.m_target)
		{
			targetDesc desc = test_case.m_src;
			desc.m_target   = GL_TEXTURE_2D;

			m_rb_name	  = prepareTexture(test_case.m_src, (const GLubyte**)src_pixels, m_src_buf_name);
			m_src_tex_name = prepareTexture(desc, (const GLubyte**)src_pixels, m_src_buf_name);
		}
		else
		{
			m_src_tex_name = prepareTexture(test_case.m_src, (const GLubyte**)src_pixels, m_src_buf_name);
		}

		/* Copy images and verify results */
		result = copyAndVerify(test_case, (const GLubyte**)dst_pixels, (const GLubyte**)src_pixels);
	}
	catch (tcu::Exception& exc)
	{
		clean();
		cleanPixels((GLubyte**)dst_pixels);
		cleanPixels((GLubyte**)src_pixels);
		throw exc;
	}

	/* Free resources */
	clean();
	cleanPixels((GLubyte**)dst_pixels);
	cleanPixels((GLubyte**)src_pixels);

	/* Set result */
	if (true == result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

		/* Increase index */
		m_test_case_index += 1;

		/* Are there any test cases left */
		if (m_test_cases.size() > m_test_case_index)
		{
			it_result = tcu::TestNode::CONTINUE;
		}
	}
	else
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Failure. " << tcu::TestLog::EndMessage;

		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return it_result;
}